

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O2

void __thiscall
ADynamicLight::CollectWithinRadius
          (ADynamicLight *this,DVector3 *pos,subsector_t *subSec,float radius)

{
  uint uVar1;
  seg_t *psVar2;
  void *linkto;
  long lVar3;
  double *pdVar4;
  line_t *plVar5;
  sector_t *psVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  FLightNode *pFVar10;
  subsector_t *psVar11;
  uint i;
  ulong uVar12;
  ADynamicLight *this_00;
  long lVar13;
  undefined1 local_78 [40];
  DThinker *local_50;
  DVector2 local_48;
  
  if (subSec != (subsector_t *)0x0) {
    subSec->validcount = validcount;
    this_00 = (ADynamicLight *)&subSec->lighthead;
    pFVar10 = AddLightNode((FLightNode **)this_00,subSec,this,&this->touching_subsectors);
    this->touching_subsectors = pFVar10;
    if (subSec->sector->validcount != validcount) {
      this_00 = (ADynamicLight *)&subSec->render_sector->lighthead;
      pFVar10 = AddLightNode((FLightNode **)this_00,subSec->sector,this,&this->touching_sector);
      this->touching_sector = pFVar10;
      subSec->sector->validcount = validcount;
    }
    dVar7 = (double)radius;
    local_50 = (DThinker *)&this->touching_sides;
    lVar13 = 0;
    for (uVar12 = 0; uVar12 < subSec->numlines; uVar12 = uVar12 + 1) {
      psVar2 = subSec->firstline;
      dVar8 = DistToSeg(this_00,pos,(seg_t *)((long)&psVar2->v1 + lVar13));
      if (dVar8 <= dVar7) {
        linkto = *(void **)((long)&psVar2->sidedef + lVar13);
        if ((((linkto != (void *)0x0) &&
             (lVar3 = *(long *)((long)&psVar2->linedef + lVar13), lVar3 != 0)) &&
            (*(int *)(lVar3 + 0x88) != validcount)) &&
           (pdVar4 = *(double **)((long)&psVar2->v1 + lVar13),
           this_00 = *(ADynamicLight **)((long)&psVar2->v2 + lVar13), dVar8 = *pdVar4,
           dVar9 = pdVar4[1],
           ((double)(this_00->super_AActor).super_DThinker.super_DObject.Class - dVar9) *
           (dVar8 - pos->X) +
           ((double)(this_00->super_AActor).super_DThinker.super_DObject._vptr_DObject - dVar8) *
           (pos->Y - dVar9) <= 0.0)) {
          *(int *)(lVar3 + 0x88) = validcount;
          this_00 = (ADynamicLight *)((long)linkto + 0xc0);
          pFVar10 = AddLightNode((FLightNode **)this_00,linkto,this,(FLightNode **)local_50);
          this->touching_sides = pFVar10;
        }
        lVar3 = *(long *)((long)&psVar2->linedef + lVar13);
        if (lVar3 != 0) {
          uVar1 = *(uint *)(lVar3 + 0x90);
          if (((linePortals.Array != (FLinePortal *)0x0 && uVar1 < linePortals.Count) &&
              (linePortals.Array[uVar1].mType == '\x03')) &&
             (plVar5 = linePortals.Array[uVar1].mDestination, plVar5->validcount != validcount)) {
            local_78._0_8_ = (plVar5->delta).X * 0.5 + (plVar5->v1->p).X;
            local_78._8_8_ = (plVar5->delta).Y * 0.5 + (plVar5->v1->p).Y;
            this_00 = (ADynamicLight *)local_78;
            psVar11 = R_PointInSubsector((DVector2 *)this_00);
            if (psVar11->validcount != validcount) {
              local_78._32_8_ = psVar11;
              AActor::PosRelative((DVector3 *)local_78,&this->super_AActor,plVar5);
              this_00 = this;
              CollectWithinRadius(this,(DVector3 *)local_78,(subsector_t *)local_78._32_8_,radius);
            }
          }
        }
        lVar3 = *(long *)((long)&psVar2->PartnerSeg + lVar13);
        if (((lVar3 != 0) &&
            (psVar11 = *(subsector_t **)(lVar3 + 0x38), psVar11 != (subsector_t *)0x0)) &&
           (psVar11->validcount != validcount)) {
          this_00 = this;
          CollectWithinRadius(this,pos,psVar11,radius);
        }
      }
      lVar13 = lVar13 + 0x48;
    }
    psVar6 = subSec->sector;
    if ((psVar6->planes[1].Flags & 0x1d8U) == 0x100) {
      dVar8 = (this->super_AActor).__Pos.Z + dVar7;
      if (sectorPortals.Array[psVar6->Portals[1]].mPlaneZ <= dVar8 &&
          dVar8 != sectorPortals.Array[psVar6->Portals[1]].mPlaneZ) {
        plVar5 = subSec->firstline->linedef;
        dVar8 = sectorPortals.Array[psVar6->Portals[1]].mDisplacement.Y +
                (plVar5->delta).Y * 0.5 + (plVar5->v1->p).Y;
        local_48.Y._0_4_ = SUB84(dVar8,0);
        local_48.X = sectorPortals.Array[psVar6->Portals[1]].mDisplacement.X +
                     (plVar5->delta).X * 0.5 + (plVar5->v1->p).X;
        local_48.Y._4_4_ = (int)((ulong)dVar8 >> 0x20);
        psVar11 = R_PointInSubsector(&local_48);
        if (psVar11->validcount != validcount) {
          AActor::PosRelative((DVector3 *)local_78,&this->super_AActor,psVar11->sector);
          CollectWithinRadius(this,(DVector3 *)local_78,psVar11,radius);
        }
      }
    }
    if ((psVar6->planes[0].Flags & 0x1d8U) == 0x100) {
      if ((this->super_AActor).__Pos.Z - dVar7 < sectorPortals.Array[psVar6->Portals[0]].mPlaneZ) {
        plVar5 = subSec->firstline->linedef;
        dVar7 = sectorPortals.Array[psVar6->Portals[0]].mDisplacement.Y +
                (plVar5->delta).Y * 0.5 + (plVar5->v1->p).Y;
        local_48.Y._0_4_ = SUB84(dVar7,0);
        local_48.X = sectorPortals.Array[psVar6->Portals[0]].mDisplacement.X +
                     (plVar5->delta).X * 0.5 + (plVar5->v1->p).X;
        local_48.Y._4_4_ = (int)((ulong)dVar7 >> 0x20);
        psVar11 = R_PointInSubsector(&local_48);
        if (psVar11->validcount != validcount) {
          AActor::PosRelative((DVector3 *)local_78,&this->super_AActor,psVar11->sector);
          CollectWithinRadius(this,(DVector3 *)local_78,psVar11,radius);
        }
      }
    }
  }
  return;
}

Assistant:

void ADynamicLight::CollectWithinRadius(const DVector3 &pos, subsector_t *subSec, float radius)
{
	if (!subSec) return;

	subSec->validcount = ::validcount;

	touching_subsectors = AddLightNode(&subSec->lighthead, subSec, this, touching_subsectors);
	if (subSec->sector->validcount != ::validcount)
	{
		touching_sector = AddLightNode(&subSec->render_sector->lighthead, subSec->sector, this, touching_sector);
		subSec->sector->validcount = ::validcount;
	}

	for (unsigned int i = 0; i < subSec->numlines; i++)
	{
		seg_t * seg = subSec->firstline + i;

		// check distance from x/y to seg and if within radius add this seg and, if present the opposing subsector (lather/rinse/repeat)
		// If out of range we do not need to bother with this seg.
		if (DistToSeg(pos, seg) <= radius)
		{
			if (seg->sidedef && seg->linedef && seg->linedef->validcount != ::validcount)
			{
				// light is in front of the seg
				if ((pos.Y - seg->v1->fY()) * (seg->v2->fX() - seg->v1->fX()) + (seg->v1->fX() - pos.X) * (seg->v2->fY() - seg->v1->fY()) <= 0)
				{
					seg->linedef->validcount = validcount;
					touching_sides = AddLightNode(&seg->sidedef->lighthead, seg->sidedef, this, touching_sides);
				}
			}
			if (seg->linedef)
			{
				FLinePortal *port = seg->linedef->getPortal();
				if (port && port->mType == PORTT_LINKED)
				{
					line_t *other = port->mDestination;
					if (other->validcount != ::validcount)
					{
						subsector_t *othersub = R_PointInSubsector(other->v1->fPos() + other->Delta() / 2);
						if (othersub->validcount != ::validcount) CollectWithinRadius(PosRelative(other), othersub, radius);
					}
				}
			}

			seg_t *partner = seg->PartnerSeg;
			if (partner)
			{
				subsector_t *sub = partner->Subsector;
				if (sub != NULL && sub->validcount != ::validcount)
				{
					CollectWithinRadius(pos, sub, radius);
				}
			}
		}
	}
	sector_t *sec = subSec->sector;
	if (!sec->PortalBlocksSight(sector_t::ceiling))
	{
		line_t *other = subSec->firstline->linedef;
		if (sec->GetPortalPlaneZ(sector_t::ceiling) < Z() + radius)
		{
			DVector2 refpos = other->v1->fPos() + other->Delta() / 2 + sec->GetPortalDisplacement(sector_t::ceiling);
			subsector_t *othersub = R_PointInSubsector(refpos);
			if (othersub->validcount != ::validcount) CollectWithinRadius(PosRelative(othersub->sector), othersub, radius);
		}
	}
	if (!sec->PortalBlocksSight(sector_t::floor))
	{
		line_t *other = subSec->firstline->linedef;
		if (sec->GetPortalPlaneZ(sector_t::floor) > Z() - radius)
		{
			DVector2 refpos = other->v1->fPos() + other->Delta() / 2 + sec->GetPortalDisplacement(sector_t::floor);
			subsector_t *othersub = R_PointInSubsector(refpos);
			if (othersub->validcount != ::validcount) CollectWithinRadius(PosRelative(othersub->sector), othersub, radius);
		}
	}
}